

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_horizontal_4_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  undefined1 (*pauVar22) [16];
  undefined8 *puVar23;
  __m128i *in_RCX;
  __m128i *in_RDX;
  int in_ESI;
  undefined1 (*in_RDI) [16];
  __m128i *in_R8;
  __m128i *in_R9;
  ulong uVar24;
  undefined1 auVar25 [16];
  ulong uVar26;
  uint8_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  int in_stack_00000018;
  __m128i qs [2];
  __m128i ps [2];
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i t80;
  __m128i one;
  __m128i ffff;
  __m128i abs_q1q0;
  __m128i abs_p1p0;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i zero;
  __m128i q [2];
  __m128i p_1 [2];
  __m128i flat;
  __m128i mask;
  __m128i thresh0;
  __m128i limit0;
  __m128i blimit0;
  int in_stack_000002f0;
  __m128i *in_stack_000002f8;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  __m128i *th;
  undefined4 in_stack_fffffffffffff9f8;
  longlong local_558 [2];
  undefined8 local_548;
  undefined8 uStack_540;
  undefined2 local_538;
  undefined2 uStack_536;
  undefined2 uStack_534;
  undefined2 uStack_532;
  undefined2 uStack_530;
  undefined2 uStack_52e;
  undefined2 uStack_52c;
  undefined2 uStack_52a;
  ulong local_528;
  ulong uStack_520;
  ulong local_518;
  ulong uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined1 local_4f8 [16];
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  ushort local_498;
  ushort uStack_496;
  ushort uStack_494;
  ushort uStack_492;
  ushort uStack_490;
  ushort uStack_48e;
  ushort uStack_48c;
  ushort uStack_48a;
  undefined8 local_488;
  undefined8 uStack_480;
  longlong local_478 [2];
  longlong local_468;
  longlong lStack_460;
  longlong local_458;
  longlong lStack_450;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined1 local_3c8 [16];
  ulong local_3b8;
  ulong uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  ulong local_368;
  ulong uStack_360;
  ulong local_358;
  ulong uStack_350;
  undefined2 local_33e;
  undefined4 local_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  __m128i *palStack_2d0;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  __m128i *palStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined8 local_228;
  undefined8 uStack_220;
  longlong local_218;
  longlong lStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  __m128i *palStack_170;
  undefined8 local_168;
  __m128i *palStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  __m128i *palStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  __m128i *palStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  longlong local_c8;
  longlong lStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  longlong local_a8;
  longlong lStack_a0;
  undefined1 local_98 [16];
  ulong local_88;
  ulong uStack_80;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  pauVar21 = (undefined1 (*) [16])((long)in_RDI + (long)(in_ESI * 2) * -2);
  local_638 = *(undefined8 *)*pauVar21;
  th = *(__m128i **)(*pauVar21 + 8);
  pauVar22 = (undefined1 (*) [16])((long)in_RDI + (long)in_ESI * -2);
  local_648 = *(undefined8 *)*pauVar22;
  uStack_640 = *(undefined8 *)(*pauVar22 + 8);
  local_658 = *(undefined8 *)*in_RDI;
  uStack_650 = *(undefined8 *)(*in_RDI + 8);
  pauVar1 = (undefined1 (*) [16])(*in_RDI + (long)in_ESI * 2);
  local_668 = *(undefined8 *)*pauVar1;
  uStack_660 = *(undefined8 *)(*pauVar1 + 8);
  local_3e0 = &local_638;
  local_3e8 = &local_648;
  local_3f0 = &local_658;
  local_3f8 = &local_668;
  local_400 = &local_688;
  local_408 = &local_6a8;
  local_3d8 = 0;
  uStack_3d0 = 0;
  local_4e8 = 0;
  uStack_4e0 = 0;
  local_238 = psubusw(*in_RDI,*pauVar22);
  local_248 = psubusw(*pauVar22,*in_RDI);
  local_4f8._0_8_ = local_238._0_8_ | local_248._0_8_;
  local_4f8._8_8_ = local_238._8_8_ | local_248._8_8_;
  local_278 = psubusw(*pauVar1,*pauVar21);
  local_288 = psubusw(*pauVar21,*pauVar1);
  local_508 = local_278._0_8_ | local_288._0_8_;
  uStack_500 = local_278._8_8_ | local_288._8_8_;
  local_2b8 = psubusw(*pauVar21,*pauVar22);
  local_2c8 = psubusw(*pauVar22,*pauVar21);
  local_518 = local_2b8._0_8_ | local_2c8._0_8_;
  uStack_510 = local_2b8._8_8_ | local_2c8._8_8_;
  local_2f8 = psubusw(*pauVar1,*in_RDI);
  local_308 = psubusw(*in_RDI,*pauVar1);
  local_528 = local_2f8._0_8_ | local_308._0_8_;
  uStack_520 = local_2f8._8_8_ | local_308._8_8_;
  local_538 = 0xffff;
  uStack_536 = 0xffff;
  uStack_534 = 0xffff;
  uStack_532 = 0xffff;
  uStack_530 = 0xffff;
  uStack_52e = 0xffff;
  uStack_52c = 0xffff;
  uStack_52a = 0xffff;
  local_33e = 1;
  local_2 = 1;
  local_4 = 1;
  local_6 = 1;
  local_8 = 1;
  local_a = 1;
  local_c = 1;
  local_e = 1;
  local_10 = 1;
  local_548 = 0x1000100010001;
  uStack_540 = 0x1000100010001;
  local_368 = local_518;
  uStack_360 = uStack_510;
  local_358 = local_518;
  uStack_350 = uStack_510;
  local_328 = local_658;
  uStack_320 = uStack_650;
  local_318 = local_668;
  uStack_310 = uStack_660;
  local_2e8 = local_648;
  uStack_2e0 = uStack_640;
  local_2d8 = local_638;
  palStack_2d0 = th;
  local_2a8 = local_638;
  palStack_2a0 = th;
  local_298 = local_668;
  uStack_290 = uStack_660;
  local_268 = local_648;
  uStack_260 = uStack_640;
  local_258 = local_658;
  uStack_250 = uStack_650;
  local_1c8 = local_658;
  uStack_1c0 = uStack_650;
  local_1b8 = local_648;
  uStack_1b0 = uStack_640;
  local_1a8 = local_648;
  uStack_1a0 = uStack_640;
  local_198 = local_658;
  uStack_190 = uStack_650;
  local_188 = local_668;
  uStack_180 = uStack_660;
  local_178 = local_638;
  palStack_170 = th;
  local_168 = local_638;
  palStack_160 = th;
  local_158 = local_668;
  uStack_150 = uStack_660;
  local_148 = local_638;
  palStack_140 = th;
  local_138 = local_648;
  uStack_130 = uStack_640;
  local_128 = local_648;
  uStack_120 = uStack_640;
  local_118 = local_638;
  palStack_110 = th;
  local_108 = local_668;
  uStack_100 = uStack_660;
  local_f8 = local_658;
  uStack_f0 = uStack_650;
  local_e8 = local_658;
  uStack_e0 = uStack_650;
  local_d8 = local_668;
  uStack_d0 = uStack_660;
  local_28 = local_548;
  uStack_20 = uStack_540;
  get_limit_dual((uint8_t *)in_RDX,(uint8_t *)in_RCX,(uint8_t *)in_R8,(uint8_t *)in_R9,
                 in_stack_00000008,in_stack_00000010,in_stack_00000018,(__m128i *)&local_458,
                 (__m128i *)&local_468,&local_478,&local_558);
  local_38 = local_518;
  uVar19 = local_38;
  uStack_30 = uStack_510;
  uVar20 = uStack_30;
  local_48 = local_528;
  uVar17 = local_48;
  uStack_40 = uStack_520;
  uVar18 = uStack_40;
  local_38._0_2_ = (short)local_518;
  local_38._2_2_ = (short)(local_518 >> 0x10);
  local_38._4_2_ = (short)(local_518 >> 0x20);
  local_38._6_2_ = (short)(local_518 >> 0x30);
  uStack_30._0_2_ = (short)uStack_510;
  uStack_30._2_2_ = (short)(uStack_510 >> 0x10);
  uStack_30._4_2_ = (short)(uStack_510 >> 0x20);
  uStack_30._6_2_ = (short)(uStack_510 >> 0x30);
  local_48._0_2_ = (short)local_528;
  local_48._2_2_ = (short)(local_528 >> 0x10);
  local_48._4_2_ = (short)(local_528 >> 0x20);
  local_48._6_2_ = (short)(local_528 >> 0x30);
  uStack_40._0_2_ = (short)uStack_520;
  uStack_40._2_2_ = (short)(uStack_520 >> 0x10);
  uStack_40._4_2_ = (short)(uStack_520 >> 0x20);
  uStack_40._6_2_ = (short)(uStack_520 >> 0x30);
  local_498 = (ushort)((short)local_38 < (short)local_48) * (short)local_48 |
              (ushort)((short)local_38 >= (short)local_48) * (short)local_38;
  uStack_496 = (ushort)(local_38._2_2_ < local_48._2_2_) * local_48._2_2_ |
               (ushort)(local_38._2_2_ >= local_48._2_2_) * local_38._2_2_;
  uStack_494 = (ushort)(local_38._4_2_ < local_48._4_2_) * local_48._4_2_ |
               (ushort)(local_38._4_2_ >= local_48._4_2_) * local_38._4_2_;
  uStack_492 = (ushort)(local_38._6_2_ < local_48._6_2_) * local_48._6_2_ |
               (ushort)(local_38._6_2_ >= local_48._6_2_) * local_38._6_2_;
  uStack_490 = (ushort)((short)uStack_30 < (short)uStack_40) * (short)uStack_40 |
               (ushort)((short)uStack_30 >= (short)uStack_40) * (short)uStack_30;
  uStack_48e = (ushort)(uStack_30._2_2_ < uStack_40._2_2_) * uStack_40._2_2_ |
               (ushort)(uStack_30._2_2_ >= uStack_40._2_2_) * uStack_30._2_2_;
  uStack_48c = (ushort)(uStack_30._4_2_ < uStack_40._4_2_) * uStack_40._4_2_ |
               (ushort)(uStack_30._4_2_ >= uStack_40._4_2_) * uStack_30._4_2_;
  uStack_48a = (ushort)(uStack_30._6_2_ < uStack_40._6_2_) * uStack_40._6_2_ |
               (ushort)(uStack_30._6_2_ >= uStack_40._6_2_) * uStack_30._6_2_;
  local_1d8 = local_4f8._0_8_;
  uStack_1d0 = local_4f8._8_8_;
  local_1e8 = local_4f8._0_8_;
  uStack_1e0 = local_4f8._8_8_;
  auVar5._8_8_ = local_4f8._8_8_;
  auVar5._0_8_ = local_4f8._0_8_;
  auVar4._8_8_ = local_4f8._8_8_;
  auVar4._0_8_ = local_4f8._0_8_;
  local_4f8 = paddusw(auVar5,auVar4);
  local_338 = local_508;
  uVar15 = local_338;
  uStack_330 = uStack_500;
  uVar16 = uStack_330;
  local_33c = 1;
  local_338._0_2_ = (ushort)local_508;
  local_338._2_2_ = (ushort)(local_508 >> 0x10);
  local_338._4_2_ = (ushort)(local_508 >> 0x20);
  uStack_330._0_2_ = (ushort)uStack_500;
  uStack_330._2_2_ = (ushort)(uStack_500 >> 0x10);
  uStack_330._4_2_ = (ushort)(uStack_500 >> 0x20);
  uVar24 = local_508 >> 0x31;
  uVar26 = uStack_500 >> 0x31;
  local_508 = CONCAT26((ushort)uVar24,
                       CONCAT24(local_338._4_2_ >> 1,
                                CONCAT22(local_338._2_2_ >> 1,(ushort)local_338 >> 1)));
  uStack_500 = CONCAT26((ushort)uVar26,
                        CONCAT24(uStack_330._4_2_ >> 1,
                                 CONCAT22(uStack_330._2_2_ >> 1,(ushort)uStack_330 >> 1)));
  local_1f8 = local_4f8._0_8_;
  uStack_1f0 = local_4f8._8_8_;
  local_208 = local_508;
  uStack_200 = uStack_500;
  auVar3._8_8_ = uStack_500;
  auVar3._0_8_ = local_508;
  local_98 = paddusw(local_4f8,auVar3);
  local_a8 = local_458;
  lStack_a0 = lStack_450;
  auVar8._8_8_ = lStack_450;
  auVar8._0_8_ = local_458;
  auVar25 = psubusw(local_98,auVar8);
  local_488 = auVar25._0_8_;
  uStack_480 = auVar25._8_8_;
  local_378 = local_488;
  uVar13 = local_378;
  uStack_370 = uStack_480;
  uVar14 = uStack_370;
  local_388 = local_4e8;
  uVar11 = local_388;
  uStack_380 = uStack_4e0;
  uVar12 = uStack_380;
  local_378._0_2_ = auVar25._0_2_;
  local_378._2_2_ = auVar25._2_2_;
  local_378._4_2_ = auVar25._4_2_;
  local_378._6_2_ = auVar25._6_2_;
  uStack_370._0_2_ = auVar25._8_2_;
  uStack_370._2_2_ = auVar25._10_2_;
  uStack_370._4_2_ = auVar25._12_2_;
  uStack_370._6_2_ = auVar25._14_2_;
  local_388._0_2_ = (short)local_4e8;
  local_388._2_2_ = (short)((ulong)local_4e8 >> 0x10);
  local_388._4_2_ = (short)((ulong)local_4e8 >> 0x20);
  local_388._6_2_ = (short)((ulong)local_4e8 >> 0x30);
  uStack_380._0_2_ = (short)uStack_4e0;
  uStack_380._2_2_ = (short)((ulong)uStack_4e0 >> 0x10);
  uStack_380._4_2_ = (short)((ulong)uStack_4e0 >> 0x20);
  uStack_380._6_2_ = (short)((ulong)uStack_4e0 >> 0x30);
  local_78 = -(ushort)((short)local_378 == (short)local_388);
  sStack_76 = -(ushort)(local_378._2_2_ == local_388._2_2_);
  sStack_74 = -(ushort)(local_378._4_2_ == local_388._4_2_);
  sStack_72 = -(ushort)(local_378._6_2_ == local_388._6_2_);
  sStack_70 = -(ushort)((short)uStack_370 == (short)uStack_380);
  sStack_6e = -(ushort)(uStack_370._2_2_ == uStack_380._2_2_);
  sStack_6c = -(ushort)(uStack_370._4_2_ == uStack_380._4_2_);
  sStack_6a = -(ushort)(uStack_370._6_2_ == uStack_380._6_2_);
  local_88 = CONCAT26(uStack_532,CONCAT24(uStack_534,CONCAT22(uStack_536,local_538)));
  uStack_80 = CONCAT26(uStack_52a,CONCAT24(uStack_52c,CONCAT22(uStack_52e,uStack_530)));
  local_3b8 = CONCAT26(sStack_72,CONCAT24(sStack_74,CONCAT22(sStack_76,local_78))) ^ local_88;
  uStack_3b0 = CONCAT26(sStack_6a,CONCAT24(sStack_6c,CONCAT22(sStack_6e,sStack_70))) ^ uStack_80;
  local_218 = local_468;
  lStack_210 = lStack_460;
  local_228 = local_548;
  uStack_220 = uStack_540;
  auVar2._8_8_ = lStack_460;
  auVar2._0_8_ = local_468;
  auVar25._8_8_ = uStack_540;
  auVar25._0_8_ = local_548;
  local_3c8 = paddusw(auVar2,auVar25);
  uVar24 = local_3b8 & local_3c8._0_8_;
  uVar26 = uStack_3b0 & local_3c8._8_8_;
  local_58 = CONCAT26(uStack_492,CONCAT24(uStack_494,CONCAT22(uStack_496,local_498)));
  uStack_50 = CONCAT26(uStack_48a,CONCAT24(uStack_48c,CONCAT22(uStack_48e,uStack_490)));
  local_68._0_2_ = (short)uVar24;
  local_68._2_2_ = (short)(uVar24 >> 0x10);
  local_68._4_2_ = (short)(uVar24 >> 0x20);
  local_68._6_2_ = (short)(uVar24 >> 0x30);
  uStack_60._0_2_ = (short)uVar26;
  uStack_60._2_2_ = (short)(uVar26 >> 0x10);
  uStack_60._4_2_ = (short)(uVar26 >> 0x20);
  uStack_60._6_2_ = (short)(uVar26 >> 0x30);
  local_488._0_4_ =
       CONCAT22((ushort)((short)uStack_496 < local_68._2_2_) * local_68._2_2_ |
                ((short)uStack_496 >= local_68._2_2_) * uStack_496,
                (ushort)((short)local_498 < (short)local_68) * (short)local_68 |
                ((short)local_498 >= (short)local_68) * local_498);
  local_488._0_6_ =
       CONCAT24((ushort)((short)uStack_494 < local_68._4_2_) * local_68._4_2_ |
                ((short)uStack_494 >= local_68._4_2_) * uStack_494,(undefined4)local_488);
  local_488 = CONCAT26((ushort)((short)uStack_492 < local_68._6_2_) * local_68._6_2_ |
                       ((short)uStack_492 >= local_68._6_2_) * uStack_492,(undefined6)local_488);
  uStack_480._0_2_ =
       (ushort)((short)uStack_490 < (short)uStack_60) * (short)uStack_60 |
       ((short)uStack_490 >= (short)uStack_60) * uStack_490;
  uStack_480._2_2_ =
       (ushort)((short)uStack_48e < uStack_60._2_2_) * uStack_60._2_2_ |
       ((short)uStack_48e >= uStack_60._2_2_) * uStack_48e;
  uStack_480._4_2_ =
       (ushort)((short)uStack_48c < uStack_60._4_2_) * uStack_60._4_2_ |
       ((short)uStack_48c >= uStack_60._4_2_) * uStack_48c;
  uStack_480._6_2_ =
       (ushort)((short)uStack_48a < uStack_60._6_2_) * uStack_60._6_2_ |
       ((short)uStack_48a >= uStack_60._6_2_) * uStack_48a;
  local_b8 = local_488;
  uStack_b0 = uStack_480;
  local_c8 = local_468;
  lStack_c0 = lStack_460;
  auVar7._8_8_ = uStack_480;
  auVar7._0_8_ = local_488;
  auVar6._8_8_ = lStack_460;
  auVar6._0_8_ = local_468;
  auVar25 = psubusw(auVar7,auVar6);
  local_488 = auVar25._0_8_;
  uStack_480 = auVar25._8_8_;
  local_398 = local_488;
  uVar9 = local_398;
  uStack_390 = uStack_480;
  uVar10 = uStack_390;
  local_3a8 = local_4e8;
  uStack_3a0 = uStack_4e0;
  local_398._0_2_ = auVar25._0_2_;
  local_398._2_2_ = auVar25._2_2_;
  local_398._4_2_ = auVar25._4_2_;
  local_398._6_2_ = auVar25._6_2_;
  uStack_390._0_2_ = auVar25._8_2_;
  uStack_390._2_2_ = auVar25._10_2_;
  uStack_390._4_2_ = auVar25._12_2_;
  uStack_390._6_2_ = auVar25._14_2_;
  local_488._2_2_ = -(ushort)(local_398._2_2_ == local_388._2_2_);
  local_488._0_2_ = -(ushort)((short)local_398 == (short)local_388);
  local_488._4_2_ = -(ushort)(local_398._4_2_ == local_388._4_2_);
  local_488._6_2_ = -(ushort)(local_398._6_2_ == local_388._6_2_);
  uStack_480._0_2_ = -(ushort)((short)uStack_390 == (short)uStack_380);
  uStack_480._2_2_ = -(ushort)(uStack_390._2_2_ == uStack_380._2_2_);
  uStack_480._4_2_ = -(ushort)(uStack_390._4_2_ == uStack_380._4_2_);
  uStack_480._6_2_ = -(ushort)(uStack_390._6_2_ == uStack_380._6_2_);
  local_4b8 = *local_3e8;
  uStack_4b0 = local_3e8[1];
  local_4a8 = *local_3e0;
  uStack_4a0 = local_3e0[1];
  local_4d8 = *local_3f0;
  uStack_4d0 = local_3f0[1];
  local_4c8 = *local_3f8;
  uStack_4c0 = local_3f8[1];
  local_398 = uVar9;
  uStack_390 = uVar10;
  local_388 = uVar11;
  uStack_380 = uVar12;
  local_378 = uVar13;
  uStack_370 = uVar14;
  local_338 = uVar15;
  uStack_330 = uVar16;
  local_68 = uVar24;
  uStack_60 = uVar26;
  local_48 = uVar17;
  uStack_40 = uVar18;
  local_38 = uVar19;
  uStack_30 = uVar20;
  highbd_filter4_dual_sse2
            ((__m128i *)CONCAT44(in_ESI,in_stack_fffffffffffff9f8),in_RDX,in_RCX,in_R8,in_R9,th,
             in_stack_000002f0,in_stack_000002f8);
  puVar23 = (undefined8 *)((long)in_RDI + (long)(in_ESI << 1) * -2);
  *puVar23 = local_678;
  puVar23[1] = uStack_670;
  puVar23 = (undefined8 *)((long)in_RDI + (long)in_ESI * -2);
  *puVar23 = local_688;
  puVar23[1] = uStack_680;
  *(undefined8 *)*in_RDI = local_6a8;
  *(undefined8 *)(*in_RDI + 8) = uStack_6a0;
  *(undefined8 *)(*in_RDI + (long)in_ESI * 2) = local_698;
  *(undefined8 *)((long)(*in_RDI + (long)in_ESI * 2) + 8) = uStack_690;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_4_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  __m128i p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  __m128i q0 = _mm_loadu_si128((__m128i *)(s - 0 * p));
  __m128i q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  __m128i ps[2], qs[2];

  highbd_lpf_internal_4_dual_sse2(&p1, &p0, &q0, &q1, ps, qs, _blimit0, _limit0,
                                  _thresh0, _blimit1, _limit1, _thresh1, bd);

  _mm_storeu_si128((__m128i *)(s - 2 * p), ps[1]);
  _mm_storeu_si128((__m128i *)(s - 1 * p), ps[0]);
  _mm_storeu_si128((__m128i *)(s + 0 * p), qs[0]);
  _mm_storeu_si128((__m128i *)(s + 1 * p), qs[1]);
}